

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall mognetwork::Socket::create(Socket *this,SocketFD fd)

{
  SocketFD SVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  int yes;
  int yes_1;
  undefined4 local_20;
  undefined4 local_1c;
  
  iVar2 = this->m_socket;
  SVar1 = OsSocket::notValid();
  if (iVar2 == SVar1) {
    this->m_socket = fd;
    if (this->m_type == Tcp) {
      local_1c = 1;
      iVar2 = setsockopt(fd,6,1,&local_1c,4);
      if (iVar2 != -1) {
        return;
      }
      pcVar4 = "Cannot set option \"TCP_NODELAY\" on the sockets.";
      lVar3 = 0x2f;
    }
    else {
      local_20 = 1;
      iVar2 = setsockopt(fd,1,6,&local_20,4);
      if (iVar2 != -1) {
        return;
      }
      pcVar4 = "Failed to enable broadcast on UDP socket.";
      lVar3 = 0x29;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar3);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  return;
}

Assistant:

void Socket::create(SocketFD fd)
  {
    if (m_socket == mognetwork::OsSocket::notValid())
      {
	m_socket = fd;
	if (m_type == Tcp)
	  {
	    int yes = 1;
	    if (setsockopt(m_socket, IPPROTO_TCP, TCP_NODELAY, reinterpret_cast<char*>(&yes), sizeof(yes)) == -1)
	      {
		std::cerr << "Cannot set option \"TCP_NODELAY\" on the sockets." << std::endl;
	      }

#ifdef OS_MAC
	    if (setsockopt(m_socket, SOL_SOCKET, SO_NOSIGPIPE, reinterpret_cast<char*>(&yes), sizeof(yes)) == -1)
	      {
		std::cerr << "Cannot set option \"SO_NOSIGPIPE\" on the socket." << std::endl;
	      }
#endif // OS_MAC
	  }
	else
	  {
	    int yes = 1;
	    if (setsockopt(m_socket, SOL_SOCKET, SO_BROADCAST, reinterpret_cast<char*>(&yes), sizeof(yes)) == -1)
	      {
		std::cerr << "Failed to enable broadcast on UDP socket." << std::endl;
	      }
	  }
      }
  }